

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBlur.cpp
# Opt level: O2

void __thiscall
Rml::FilterBlur::ExtendInkOverflow(FilterBlur *this,Element *element,Rectanglef *scissor_region)

{
  float fVar1;
  Rectangle<float> RVar2;
  
  fVar1 = Element::ResolveLength(element,this->sigma_value);
  if (fVar1 <= 1.0) {
    fVar1 = 1.0;
  }
  RVar2 = Rectangle<float>::Extend(scissor_region,fVar1 * 3.0);
  scissor_region->p0 = RVar2.p0;
  scissor_region->p1 = RVar2.p1;
  return;
}

Assistant:

void FilterBlur::ExtendInkOverflow(Element* element, Rectanglef& scissor_region) const
{
	const float sigma = element->ResolveLength(sigma_value);
	const float blur_extent = 3.0f * Math::Max(sigma, 1.f);
	scissor_region = scissor_region.Extend(blur_extent);
}